

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  byte in_DIL;
  bool term_supports_color;
  char *term;
  char *gtest_color;
  char *in_stack_ffffffffffffffd8;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_1;
  
  std::__cxx11::string::c_str();
  bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f3af);
  if (bVar1) {
    posix::GetEnv((char *)0x14f3c4);
    bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f3da);
    local_1a = true;
    if (!bVar1) {
      bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f3fc);
      local_1a = true;
      if (!bVar1) {
        bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f41e);
        local_1a = true;
        if (!bVar1) {
          bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f43c);
          local_1a = true;
          if (!bVar1) {
            bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f45a);
            local_1a = true;
            if (!bVar1) {
              bVar1 = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f478);
              local_1a = true;
              if (!bVar1) {
                local_1a = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f496);
              }
            }
          }
        }
      }
    }
    local_1b = false;
    if ((in_DIL & 1) != 0) {
      local_1b = local_1a;
    }
    local_1 = local_1b;
  }
  else {
    bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f4d6);
    local_1c = true;
    if (!bVar1) {
      bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f4f4);
      local_1c = true;
      if (!bVar1) {
        bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f512);
        local_1c = true;
        if (!bVar1) {
          local_1c = String::CStringEquals(in_stack_ffffffffffffffd8,(char *)0x14f530);
        }
      }
    }
    local_1 = local_1c;
  }
  return local_1;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  const char* const gtest_color = GTEST_FLAG(color).c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}